

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  byte *pbVar7;
  long lVar8;
  
  pbVar3 = (byte *)this->end_;
  pbVar7 = (byte *)this->current_;
  while (((pbVar7 != pbVar3 && ((ulong)*pbVar7 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0))) {
    pbVar7 = pbVar7 + 1;
    this->current_ = (Location)pbVar7;
  }
  token->start_ = (Location)pbVar7;
  if (pbVar7 == pbVar3) {
LAB_0078ae5d:
    token->type_ = tokenEndOfStream;
    goto LAB_0078ae63;
  }
  pbVar1 = pbVar7 + 1;
  this->current_ = (Location)pbVar1;
  bVar2 = *pbVar7;
  if (0x5a < bVar2) {
    if (bVar2 < 0x6e) {
      if (bVar2 == 0x5b) {
        token->type_ = tokenArrayBegin;
      }
      else {
        if (bVar2 != 0x5d) {
          if ((bVar2 == 0x66) && (token->type_ = tokenFalse, 3 < (long)pbVar3 - (long)pbVar1)) {
            lVar8 = 4;
            do {
              if (lVar8 == 0) {
                pbVar7 = pbVar7 + 5;
                goto LAB_0078af1c;
              }
              pbVar3 = pbVar7 + lVar8;
              pbVar1 = (byte *)("False" + lVar8);
              lVar8 = lVar8 + -1;
            } while (*pbVar3 == *pbVar1);
          }
          goto switchD_0078ad69_caseD_23;
        }
        token->type_ = tokenArrayEnd;
      }
    }
    else {
      if (bVar2 < 0x7b) {
        if (bVar2 == 0x6e) {
          token->type_ = tokenNull;
          if (2 < (long)pbVar3 - (long)pbVar1) {
            lVar8 = 3;
            do {
              if (lVar8 == 0) goto LAB_0078af12;
              pbVar3 = pbVar7 + lVar8;
              lVar4 = lVar8 + 0x4b;
              lVar8 = lVar8 + -1;
            } while (*pbVar3 ==
                     "Operation made no progress over multiple calls, due to output buffer being full"
                     [lVar4]);
          }
        }
        else if ((bVar2 == 0x74) && (token->type_ = tokenTrue, 2 < (long)pbVar3 - (long)pbVar1)) {
          lVar8 = 3;
          do {
            if (lVar8 == 0) goto LAB_0078af12;
            pbVar3 = pbVar7 + lVar8;
            pbVar1 = (byte *)("True" + lVar8);
            lVar8 = lVar8 + -1;
          } while (*pbVar3 == *pbVar1);
        }
        goto switchD_0078ad69_caseD_23;
      }
      if (bVar2 == 0x7d) {
        token->type_ = tokenObjectEnd;
      }
      else {
        if (bVar2 != 0x7b) goto switchD_0078ad69_caseD_23;
        token->type_ = tokenObjectBegin;
      }
    }
    goto LAB_0078ae63;
  }
  switch(bVar2) {
  case 0x22:
    token->type_ = tokenString;
    bVar6 = readString(this);
    goto LAB_0078ae96;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
    break;
  case 0x2c:
    token->type_ = tokenArraySeparator;
    goto LAB_0078ae63;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    token->type_ = tokenNumber;
    readNumber(this);
    goto LAB_0078ae63;
  case 0x2f:
    token->type_ = tokenComment;
    bVar6 = readComment(this);
LAB_0078ae96:
    bVar5 = true;
    if (bVar6 != false) goto LAB_0078ae65;
    break;
  case 0x3a:
    token->type_ = tokenMemberSeparator;
LAB_0078ae63:
    bVar5 = true;
    goto LAB_0078ae65;
  default:
    if (bVar2 == 0) goto LAB_0078ae5d;
  }
switchD_0078ad69_caseD_23:
  token->type_ = tokenError;
  bVar5 = false;
LAB_0078ae65:
  token->end_ = this->current_;
  return bVar5;
LAB_0078af12:
  pbVar7 = pbVar7 + 4;
LAB_0078af1c:
  this->current_ = (Location)pbVar7;
  goto LAB_0078ae63;
}

Assistant:

bool Reader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '-':
    token.type_ = tokenNumber;
    readNumber();
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return ok;
}